

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatWatchList.h
# Opt level: O0

void xSAT_WatchListRemove(xSAT_WatchList_t *v,uint CRef)

{
  int iVar1;
  xSAT_Watcher_t *pxVar2;
  int local_24;
  int j;
  xSAT_Watcher_t *ws;
  uint CRef_local;
  xSAT_WatchList_t *v_local;
  
  pxVar2 = xSAT_WatchListArray(v);
  local_24 = 0;
  while (pxVar2[local_24].CRef != CRef) {
    local_24 = local_24 + 1;
  }
  iVar1 = xSAT_WatchListSize(v);
  if (local_24 < iVar1) {
    memmove(v->pArray + local_24,v->pArray + (long)local_24 + 1,
            (long)((v->nSize - local_24) + -1) << 3);
    v->nSize = v->nSize + -1;
    return;
  }
  __assert_fail("j < xSAT_WatchListSize( v )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                ,0xab,"void xSAT_WatchListRemove(xSAT_WatchList_t *, unsigned int)");
}

Assistant:

static inline void xSAT_WatchListRemove( xSAT_WatchList_t * v, unsigned CRef )
{
    xSAT_Watcher_t* ws = xSAT_WatchListArray(v);
    int j = 0;

    for ( ; ws[j].CRef != CRef; j++ );
    assert( j < xSAT_WatchListSize( v ) );
    memmove( v->pArray + j, v->pArray + j + 1, ( v->nSize - j - 1 ) * sizeof( xSAT_Watcher_t ) );
    v->nSize -= 1;
}